

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O2

XrResult __thiscall
RuntimeInterface::CreateInstance
          (RuntimeInterface *this,XrInstanceCreateInfo *info,XrInstance *instance)

{
  __uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
  __p;
  XrResult XVar1;
  tuple<XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_> table;
  __uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
  *this_00;
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
  dispatch_table;
  PFN_xrCreateInstance rt_xrCreateInstance;
  __uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
  local_30;
  PFN_xrVoidFunction local_28;
  
  (*this->_get_instance_proc_addr)((XrInstance)0x0,"xrCreateInstance",&local_28);
  XVar1 = (*local_28)(info);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    table.
    super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
    .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
          )operator_new(0x1f8);
    memset((void *)table.
                   super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
                   .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl,0,
           0x1f8);
    local_30._M_t.
    super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
    .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl =
         (tuple<XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>)
         (tuple<XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>)
         table.
         super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
         .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl;
    GeneratedXrPopulateDispatchTableCore
              ((XrGeneratedDispatchTableCore *)
               table.
               super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
               .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl,*instance,
               this->_get_instance_proc_addr);
    std::mutex::lock(&this->_dispatch_table_mutex);
    this_00 = (__uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
               *)std::__detail::
                 _Map_base<XrInstance_T_*,_std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<XrInstance_T_*,_std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->_dispatch_table_map,instance);
    __p._M_t.
    super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
    .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl =
         local_30._M_t.
         super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
         .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl;
    local_30._M_t.
    super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
    .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl =
         (tuple<XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>)
         (_Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
          )0x0;
    std::
    __uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
    ::reset(this_00,(pointer)__p._M_t.
                             super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
                             .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>.
                             _M_head_impl);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_dispatch_table_mutex);
    std::
    unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>::
    ~unique_ptr((unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
                 *)&local_30);
  }
  return XVar1;
}

Assistant:

XrResult RuntimeInterface::CreateInstance(const XrInstanceCreateInfo* info, XrInstance* instance) {
    XrResult res = XR_SUCCESS;
    bool create_succeeded = false;
    PFN_xrCreateInstance rt_xrCreateInstance;
    _get_instance_proc_addr(XR_NULL_HANDLE, "xrCreateInstance", reinterpret_cast<PFN_xrVoidFunction*>(&rt_xrCreateInstance));
    res = rt_xrCreateInstance(info, instance);
    if (XR_SUCCEEDED(res)) {
        create_succeeded = true;
        std::unique_ptr<XrGeneratedDispatchTableCore> dispatch_table(new XrGeneratedDispatchTableCore());
        GeneratedXrPopulateDispatchTableCore(dispatch_table.get(), *instance, _get_instance_proc_addr);
        std::lock_guard<std::mutex> mlock(_dispatch_table_mutex);
        _dispatch_table_map[*instance] = std::move(dispatch_table);
    }

    // If the failure occurred during the populate, clean up the instance we had picked up from the runtime
    if (XR_FAILED(res) && create_succeeded) {
        PFN_xrDestroyInstance rt_xrDestroyInstance;
        _get_instance_proc_addr(*instance, "xrDestroyInstance", reinterpret_cast<PFN_xrVoidFunction*>(&rt_xrDestroyInstance));
        rt_xrDestroyInstance(*instance);
        *instance = XR_NULL_HANDLE;
    }

    return res;
}